

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

QString * __thiscall QWizard::buttonText(QWizard *this,WizardButton which)

{
  long lVar1;
  bool bVar2;
  QWizardPrivate *this_00;
  QWizardPrivate *in_RDI;
  long in_FS_OFFSET;
  QWizardPrivate *d;
  QString defText;
  QString *in_stack_ffffffffffffff78;
  QString *in_stack_ffffffffffffff80;
  QWizardPrivate *wizardPrivate;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QWizardPrivate *pQVar3;
  QWizardPrivate *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  wizardPrivate = in_RDI;
  pQVar3 = in_RDI;
  this_00 = d_func((QWizard *)0x7bb9f1);
  bVar2 = QWizardPrivate::ensureButton
                    (in_stack_ffffffffffffffc0,(WizardButton)((ulong)pQVar3 >> 0x20));
  if (bVar2) {
    bVar2 = QMap<int,_QString>::contains((QMap<int,_QString> *)wizardPrivate,(int *)in_RDI);
    if (bVar2) {
      QString::QString((QString *)0x7bba5d);
      QMap<int,_QString>::value
                ((QMap<int,_QString> *)this_00,
                 (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (QString *)wizardPrivate);
      QString::~QString((QString *)0x7bba80);
    }
    else {
      buttonDefaultText(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,wizardPrivate);
      bVar2 = QString::isNull((QString *)0x7bbad1);
      if (bVar2) {
        QAbstractButton::text((QAbstractButton *)in_RDI);
      }
      else {
        QString::QString(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      QString::~QString((QString *)0x7bbb1c);
    }
  }
  else {
    QString::QString((QString *)0x7bba12);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)wizardPrivate;
  }
  __stack_chk_fail();
}

Assistant:

QString QWizard::buttonText(WizardButton which) const
{
    Q_D(const QWizard);

    if (!d->ensureButton(which))
        return QString();

    if (d->buttonCustomTexts.contains(which))
        return d->buttonCustomTexts.value(which);

    const QString defText = buttonDefaultText(d->wizStyle, which, d);
    if (!defText.isNull())
        return defText;

    return d->btns[which]->text();
}